

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHaig.c
# Opt level: O2

void Abc_NtkHaigResetReprsOld(Hop_Man_t *pMan)

{
  Vec_Ptr_t *vMembers;
  Vec_Ptr_t *p;
  
  vMembers = Abc_NtkHaigCollectMembers(pMan);
  printf("Collected %6d class members.\n",(ulong)(uint)vMembers->nSize);
  p = Abc_NtkHaigCreateClasses(vMembers);
  printf("Collected %6d classes. (Ave = %5.2f)\n",(double)((float)vMembers->nSize / (float)p->nSize)
        );
  Vec_PtrFree(vMembers);
  Vec_PtrFree(p);
  return;
}

Assistant:

void Abc_NtkHaigResetReprsOld( Hop_Man_t * pMan )
{
    Vec_Ptr_t * vMembers, * vClasses;

    // collect members of the classes and make them point to reprs
    vMembers = Abc_NtkHaigCollectMembers( pMan );
    printf( "Collected %6d class members.\n", Vec_PtrSize(vMembers) );

    // create classes
    vClasses = Abc_NtkHaigCreateClasses( vMembers );
    printf( "Collected %6d classes. (Ave = %5.2f)\n", Vec_PtrSize(vClasses), 
        (float)(Vec_PtrSize(vMembers))/Vec_PtrSize(vClasses) );

    Vec_PtrFree( vMembers );
    Vec_PtrFree( vClasses );
}